

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

ImVector_TextRange * ImVector_TextRange_ImVector_TextRangeVector(ImVector_TextRange *src)

{
  uint uVar1;
  ImVector_TextRange *pIVar2;
  ImGuiTextRange *__dest;
  ulong uVar3;
  
  pIVar2 = (ImVector_TextRange *)ImGui::MemAlloc(0x10);
  pIVar2->Size = 0;
  pIVar2->Capacity = 0;
  pIVar2->Data = (ImGuiTextRange *)0x0;
  uVar1 = src->Size;
  if (0 < (long)(int)uVar1) {
    uVar3 = 8;
    if (8 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    __dest = (ImGuiTextRange *)ImGui::MemAlloc(uVar3 << 4);
    if (pIVar2->Data != (ImGuiTextRange *)0x0) {
      memcpy(__dest,pIVar2->Data,(long)pIVar2->Size << 4);
      ImGui::MemFree(pIVar2->Data);
    }
    pIVar2->Data = __dest;
    pIVar2->Capacity = (int)uVar3;
  }
  pIVar2->Size = uVar1;
  memcpy(pIVar2->Data,src->Data,(long)(int)uVar1 << 4);
  return pIVar2;
}

Assistant:

CIMGUI_API ImVector_TextRange* ImVector_TextRange_ImVector_TextRangeVector(const ImVector_TextRange src)
{
    return IM_NEW(ImVector_TextRange)(src);
}